

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_ineighbor_allgatherv_
               (void *sendbuf,MPIABI_Fint *sendcount,MPIABI_Fint *sendtype,void *recvbuf,
               int *recvcounts,int *displs,MPIABI_Fint *recvtype,MPIABI_Fint *comm,
               MPIABI_Fint *request,MPIABI_Fint *ierror)

{
  mpi_ineighbor_allgatherv_();
  return;
}

Assistant:

void mpiabi_ineighbor_allgatherv_(
  const void * sendbuf,
  const MPIABI_Fint * sendcount,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * displs,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * request,
  MPIABI_Fint * ierror
) {
  return mpi_ineighbor_allgatherv_(
    sendbuf,
    sendcount,
    sendtype,
    recvbuf,
    recvcounts,
    displs,
    recvtype,
    comm,
    request,
    ierror
  );
}